

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall Qclass_noplot_Test::TestBody(Qclass_noplot_Test *this)

{
  bool bVar1;
  char *message;
  undefined1 auStack_15fe8 [8];
  Qclass Test;
  AssertionResult gtest_ar;
  Message local_18;
  
  memset(auStack_15fe8 + 4,0,10000);
  memset(Test.grid[0x31] + 0x31,0,0x13881);
  Test._90004_8_ = 3;
  Test.goal_y = 0;
  Test._90020_4_ = 0x3fe00000;
  Test.learn_rate = 0.8;
  remove("Obstacles1.txt");
  local_18.ss_.ptr_._0_4_ = Qclass::plot((Qclass *)auStack_15fe8);
  gtest_ar.message_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&Test.disc_rew,"Test.plot()","0",(int *)&local_18,(int *)&gtest_ar.message_
            );
  if (Test.disc_rew._0_1_ == '\0') {
    testing::Message::Message(&local_18);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sudrag[P]Q-learning-for-2D-Occupancy-Grid/test/test.cpp"
               ,0x4d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (CONCAT44(local_18.ss_.ptr_._4_4_,(int)local_18.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_18.ss_.ptr_._4_4_,(int)local_18.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_18.ss_.ptr_._4_4_,(int)local_18.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Qclass::~Qclass((Qclass *)auStack_15fe8);
  return;
}

Assistant:

TEST(Qclass, noplot) {
  Qclass Test;
  remove("Obstacles1.txt");
  EXPECT_EQ(Test.plot(), 0);
}